

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

void Eigen::internal::
     generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>,Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,3>
     ::
     eval_dynamic_impl<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>,double>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>const>> *lhs,
               MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *rhs,
               assign_op<double,_double> *func)

{
  Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1>
  local_20;
  
  local_20 = MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>const>>::
             lazyProduct<Eigen::Matrix<double,_1,_1,1,_1,_1>>(lhs,rhs);
  call_restricted_packet_assignment_no_alias<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,_1,1,_1,_1>,1>,Eigen::internal::assign_op<double,double>>
            (dst,&local_20,func);
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
  void eval_dynamic_impl(Dst& dst, const LhsT& lhs, const RhsT& rhs, const Func &func, const Scalar&  s /* == 1 */, false_type)
  {
    EIGEN_UNUSED_VARIABLE(s);
    eigen_internal_assert(s==Scalar(1));
    call_restricted_packet_assignment_no_alias(dst, lhs.lazyProduct(rhs), func);
  }